

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O3

int Gia_ManFindGateGateInt
              (word *pOff,word *pOn,Vec_Ptr_t *vDivs,int nWords,Vec_Int_t *vUnatePairs,
              Vec_Int_t *vUnatePairsW,word *pDivTempA,word *pDivTempB)

{
  long lVar1;
  uint iDiv;
  int iVar2;
  uint iDiv_00;
  int iVar3;
  ulong uVar4;
  long lVar5;
  int iVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long local_50;
  
  uVar9 = (ulong)(uint)nWords;
  if (nWords < 1) {
    iVar6 = 0;
  }
  else {
    uVar4 = 0;
    iVar6 = 0;
    do {
      uVar7 = pOn[uVar4] - (pOn[uVar4] >> 1 & 0x5555555555555555);
      uVar7 = (uVar7 >> 2 & 0x3333333333333333) + (uVar7 & 0x3333333333333333);
      uVar7 = (uVar7 >> 4) + uVar7 & 0xf0f0f0f0f0f0f0f;
      uVar7 = (uVar7 >> 8) + uVar7;
      lVar8 = (uVar7 >> 0x10) + uVar7;
      iVar6 = iVar6 + ((int)((ulong)lVar8 >> 0x20) + (int)lVar8 & 0xffU);
      uVar4 = uVar4 + 1;
    } while (uVar9 != uVar4);
  }
  if (0 < vUnatePairs->nSize) {
    local_50 = 1;
    lVar8 = 0;
    do {
      if (vUnatePairsW->nSize <= lVar8) {
LAB_007a735c:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iDiv = vUnatePairs->pArray[lVar8];
      if ((int)iDiv < 0) {
LAB_007a737b:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      iVar2 = vUnatePairsW->pArray[lVar8];
      if (iVar2 * 2 < iVar6) {
        return -1;
      }
      Gia_ManDeriveDivPair(iDiv,vDivs,nWords,pDivTempA);
      lVar1 = lVar8 + 1;
      iVar3 = vUnatePairs->nSize;
      lVar5 = (long)iVar3;
      if (lVar1 < lVar5) {
        lVar5 = local_50;
        do {
          if (vUnatePairsW->nSize <= lVar5) goto LAB_007a735c;
          iDiv_00 = vUnatePairs->pArray[lVar5];
          if ((int)iDiv_00 < 0) goto LAB_007a737b;
          if (vUnatePairsW->pArray[lVar5] + iVar2 < iVar6) break;
          Gia_ManDeriveDivPair(iDiv_00,vDivs,nWords,pDivTempB);
          if ((iDiv_00 & 1) == 0 && (iDiv & 1) == 0) {
            if (nWords < 1) goto LAB_007a7333;
            uVar4 = 0;
            while ((pOn[uVar4] & ~(pDivTempB[uVar4] | pDivTempA[uVar4])) == 0) {
              uVar4 = uVar4 + 1;
              if (uVar9 == uVar4) goto LAB_007a7333;
            }
          }
          else if ((iDiv & 1) == 0) {
            if (nWords < 1) goto LAB_007a7333;
            uVar4 = 0;
            while ((pOn[uVar4] & ~pDivTempA[uVar4] & pDivTempB[uVar4]) == 0) {
              uVar4 = uVar4 + 1;
              if (uVar9 == uVar4) goto LAB_007a7333;
            }
          }
          else if ((iDiv_00 & 1) == 0) {
            if (nWords < 1) {
LAB_007a7333:
              if (-1 < (short)lVar5) {
                return (int)lVar5 << 0x11 | (int)lVar8 << 2 | 0x10003;
              }
              __assert_fail("Var >= 0 && !(c >> 1)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                            ,0x12e,"int Abc_Var2Lit(int, int)");
            }
            uVar4 = 0;
            while ((pOn[uVar4] & ~pDivTempB[uVar4] & pDivTempA[uVar4]) == 0) {
              uVar4 = uVar4 + 1;
              if (uVar9 == uVar4) goto LAB_007a7333;
            }
          }
          else {
            if (nWords < 1) goto LAB_007a7333;
            uVar4 = 0;
            while ((pOn[uVar4] & pDivTempB[uVar4] & pDivTempA[uVar4]) == 0) {
              uVar4 = uVar4 + 1;
              if (uVar9 == uVar4) goto LAB_007a7333;
            }
          }
          lVar5 = lVar5 + 1;
          iVar3 = vUnatePairs->nSize;
        } while ((int)lVar5 < iVar3);
        lVar5 = (long)iVar3;
      }
      local_50 = local_50 + 1;
      lVar8 = lVar1;
    } while (lVar1 < lVar5);
  }
  return -1;
}

Assistant:

int Gia_ManFindGateGateInt( word * pOff, word * pOn, Vec_Ptr_t * vDivs, int nWords, Vec_Int_t * vUnatePairs, Vec_Int_t * vUnatePairsW, word * pDivTempA, word * pDivTempB )
{
    int i, k, iDiv0, iDiv1, Cover0, Cover1;
    int nTotal = Abc_TtCountOnesVec( pOn, nWords );
    Vec_IntForEachEntryTwo( vUnatePairs, vUnatePairsW, iDiv0, Cover0, k )
    {
        int fCompA = Abc_LitIsCompl(iDiv0);
        if ( 2*Cover0 < nTotal )
            break;
        Gia_ManDeriveDivPair( iDiv0, vDivs, nWords, pDivTempA );
        Vec_IntForEachEntryTwoStart( vUnatePairs, vUnatePairsW, iDiv1, Cover1, i, k+1 )
        {
            int fCompB = Abc_LitIsCompl(iDiv1);
            if ( Cover0 + Cover1 < nTotal )
                break;
            Gia_ManDeriveDivPair( iDiv1, vDivs, nWords, pDivTempB );
            if ( Gia_ManDivCover(pOff, pOn, pDivTempA, fCompA, pDivTempB, fCompB, nWords) )
                return Abc_Var2Lit((Abc_Var2Lit(i, 1) << 15) | Abc_Var2Lit(k, 1), 1);
        }
    }
    return -1;
}